

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O3

int nn_ep_init(nn_ep *self,int src,nn_sock *sock,int eid,nn_transport *transport,int bind,char *addr
              )

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  size_t sVar3;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar4;
  int extraout_EDX_01;
  char *pcVar5;
  nn_fsm *self_00;
  
  iVar1 = 0x11e7ac;
  nn_fsm_init(&self->fsm,nn_ep_handler,nn_ep_shutdown,src,self,&sock->fsm);
  self->state = 1;
  self->sock = sock;
  self->eid = eid;
  self->last_errno = 0;
  nn_list_item_init(&self->item);
  (self->options).ipv4only = (sock->ep_template).ipv4only;
  iVar2 = (sock->ep_template).rcvprio;
  (self->options).sndprio = (sock->ep_template).sndprio;
  (self->options).rcvprio = iVar2;
  pcVar5 = addr;
  sVar3 = strlen(addr);
  if (sVar3 < 0x81) {
    strcpy(self->addr,addr);
    iVar1 = (*(&transport->bind)[bind == 0])(self);
    iVar2 = 0;
    if (iVar1 < 0) {
      nn_list_item_term(&self->item);
      nn_fsm_term(&self->fsm);
      iVar2 = iVar1;
    }
    return iVar2;
  }
  nn_ep_init_cold_1();
  self_00 = (nn_fsm *)(pcVar5 + 0x58);
  if (*(int *)(pcVar5 + 0x58) == 1) {
    if (iVar1 == -2) {
      uVar4 = extraout_EDX;
      if (extraout_EDX == 0xfffffffe) {
        *(undefined4 *)&self_00->fn = 2;
        return extraout_EAX;
      }
      goto LAB_0011e7df;
    }
  }
  else {
    if (*(int *)(pcVar5 + 0x58) == 2) {
      nn_ep_handler_cold_1();
    }
    nn_ep_handler_cold_4();
  }
  nn_ep_handler_cold_2();
  uVar4 = extraout_EDX_00;
LAB_0011e7df:
  nn_ep_handler_cold_3();
  if (extraout_EDX_01 != -3 || (uVar4 ^ 0xfffffffe) != 0) {
    if (*(int *)&self_00[1].fn == 3) {
      if ((uVar4 ^ 0xfffffffe) != 0 || extraout_EDX_01 != 1) {
        return extraout_EAX_00;
      }
      *(undefined4 *)&self_00[1].fn = 1;
      nn_fsm_stopped(self_00,1);
      return extraout_EAX_01;
    }
    nn_ep_shutdown_cold_1();
  }
  nn_ep_shutdown_cold_2();
  return extraout_EAX_00;
}

Assistant:

int nn_ep_init (struct nn_ep *self, int src, struct nn_sock *sock, int eid,
    const struct nn_transport *transport, int bind, const char *addr)
{
    int rc;

    nn_fsm_init (&self->fsm, nn_ep_handler, nn_ep_shutdown,
        src, self, &sock->fsm);
    self->state = NN_EP_STATE_IDLE;

    self->sock = sock;
    self->eid = eid;
    self->last_errno = 0;
    nn_list_item_init (&self->item);
    memcpy (&self->options, &sock->ep_template, sizeof(struct nn_ep_options));

    /*  Store the textual form of the address. */
    nn_assert (strlen (addr) <= NN_SOCKADDR_MAX);
    strcpy (self->addr, addr);

    /*  Create transport-specific part of the endpoint. */
    if (bind)
        rc = transport->bind (self);
    else
        rc = transport->connect (self);

    /*  Endpoint creation failed. */
    if (rc < 0) {
        nn_list_item_term (&self->item);
        nn_fsm_term (&self->fsm);
        return rc;
    }

    return 0;
}